

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O1

float * Tim_ManBoxDelayTable(Tim_Man_t *p,int iBox)

{
  int iVar1;
  void *pvVar2;
  float *pfVar3;
  
  if ((-1 < iBox) && (iBox < p->vBoxes->nSize)) {
    pvVar2 = p->vBoxes->pArray[(uint)iBox];
    iVar1 = *(int *)((long)pvVar2 + 0x10);
    if ((long)iVar1 < 0) {
      pfVar3 = (float *)0x0;
    }
    else {
      if (p->vDelayTables->nSize <= iVar1) goto LAB_004198c8;
      pfVar3 = (float *)p->vDelayTables->pArray[iVar1];
      if (*(int *)((long)pvVar2 + 8) != (int)pfVar3[1]) {
        __assert_fail("(int)pTable[1] == pBox->nInputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timBox.c"
                      ,0xf2,"float *Tim_ManBoxDelayTable(Tim_Man_t *, int)");
      }
      if (*(int *)((long)pvVar2 + 0xc) != (int)pfVar3[2]) {
        __assert_fail("(int)pTable[2] == pBox->nOutputs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timBox.c"
                      ,0xf3,"float *Tim_ManBoxDelayTable(Tim_Man_t *, int)");
      }
    }
    return pfVar3;
  }
LAB_004198c8:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

float * Tim_ManBoxDelayTable( Tim_Man_t * p, int iBox )
{
    float * pTable;
    Tim_Box_t * pBox = Tim_ManBox(p, iBox);
    if ( pBox->iDelayTable < 0 )
        return NULL;
    pTable = (float *)Vec_PtrEntry( p->vDelayTables, pBox->iDelayTable );
    assert( (int)pTable[1] == pBox->nInputs );
    assert( (int)pTable[2] == pBox->nOutputs );
    return pTable;
}